

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_inspect_global(REF_SUBDIV ref_subdiv,REF_INT global0,REF_INT global1)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar1;
  uint uVar2;
  uint uVar3;
  REF_CELL *ppRVar4;
  REF_INT cell;
  ulong uVar5;
  long lVar6;
  REF_INT edge;
  REF_INT node1;
  REF_INT node0;
  REF_INT part;
  REF_INT local_48;
  int local_44;
  int local_40;
  uint local_3c;
  long local_38;
  
  ref_node = ref_subdiv->grid->node;
  uVar2 = ref_node_local(ref_node,(long)global0,&local_40);
  if ((uVar2 == 0) || (uVar2 == 5)) {
    uVar3 = ref_node_local(ref_node,(long)global1,&local_44);
    if ((uVar3 != 0) && (uVar3 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x61
             ,"ref_subdiv_inspect_global",(ulong)uVar3,"g2l1");
      uVar2 = uVar3;
    }
    if ((uVar3 == 5) || (uVar3 == 0)) {
      if (local_44 != -1 && local_40 != -1) {
        uVar2 = ref_edge_with(ref_subdiv->edge,local_40,local_44,&local_48);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 99,"ref_subdiv_inspect_global",(ulong)uVar2,"with");
          return uVar2;
        }
        uVar2 = ref_edge_part(ref_subdiv->edge,local_48,(REF_INT *)&local_3c);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 100,"ref_subdiv_inspect_global",(ulong)uVar2,"part");
          return uVar2;
        }
        printf(" mark %d edge %d rank %d part %d global %d %d\n",
               (ulong)(uint)ref_subdiv->mark[local_48],(long)local_48,
               (ulong)(uint)ref_subdiv->grid->mpi->id,(ulong)local_3c,global0,global1);
        ppRVar4 = ref_subdiv->grid->cell + 8;
        local_38 = 8;
        do {
          ref_cell = *ppRVar4;
          cell = -1;
          uVar5 = 0xffffffff;
          if (-1 < (long)local_40) {
            uVar5 = 0xffffffff;
            if (local_40 < ref_cell->ref_adj->nnode) {
              uVar5 = (ulong)(uint)ref_cell->ref_adj->first[local_40];
            }
          }
          if ((int)uVar5 != -1) {
            cell = ref_cell->ref_adj->item[(int)uVar5].ref;
          }
          while ((int)uVar5 != -1) {
            if (0 < ref_cell->node_per) {
              lVar6 = 0;
              do {
                if (local_44 == ref_cell->c2n[(long)ref_cell->size_per * (long)cell + lVar6]) {
                  ref_subdiv_inspect_cell(ref_subdiv,ref_cell,cell);
                }
                lVar6 = lVar6 + 1;
              } while ((int)lVar6 < ref_cell->node_per);
            }
            pRVar1 = ref_cell->ref_adj->item;
            uVar5 = (ulong)pRVar1[(int)uVar5].next;
            if (uVar5 == 0xffffffffffffffff) {
              cell = -1;
            }
            else {
              cell = pRVar1[uVar5].ref;
            }
          }
          ppRVar4 = ref_subdiv->grid->cell + local_38 + 1;
          local_38 = local_38 + 1;
        } while (local_38 != 0x10);
      }
      uVar2 = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x60,
           "ref_subdiv_inspect_global",(ulong)uVar2,"g2l0");
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_inspect_global(REF_SUBDIV ref_subdiv,
                                             REF_INT global0, REF_INT global1) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_CELL ref_cell;
  REF_INT node0, node1;
  REF_INT edge, part;
  REF_INT group, item, node, cell;

  RXS(ref_node_local(ref_node, global0, &node0), REF_NOT_FOUND, "g2l0");
  RXS(ref_node_local(ref_node, global1, &node1), REF_NOT_FOUND, "g2l1");
  if (REF_EMPTY == node0 || REF_EMPTY == node1) return REF_SUCCESS;
  RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), node0, node1, &edge), "with");
  RSS(ref_edge_part(ref_subdiv_edge(ref_subdiv), edge, &part), "part");

  printf(" mark %d edge %d rank %d part %d global %d %d\n",
         ref_subdiv_mark(ref_subdiv, edge), edge,
         ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)), part, global0, global1);

  each_ref_grid_3d_ref_cell(ref_subdiv_grid(ref_subdiv), group, ref_cell) {
    each_ref_cell_having_node2(ref_cell, node0, node1, item, node, cell) {
      RSS(ref_subdiv_inspect_cell(ref_subdiv, ref_cell, cell), "insp");
    }
  }

  return REF_SUCCESS;
}